

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.hpp
# Opt level: O0

vector_type *
nanoNet::Trainer::biasGradientFromValues
          (vector_type *__return_storage_ptr__,NeuralNetworkLayer *layer,vector_type *values,
          vector_type *gradients)

{
  float fVar1;
  _Vector_base<float,_std::allocator<float>_> *p_Var2;
  size_t sVar3;
  const_reference pvVar4;
  reference pvVar5;
  float fVar6;
  ulong local_50;
  size_t i;
  allocator<float> local_31;
  value_type_conflict local_30;
  undefined1 local_29;
  vector_type *local_28;
  vector_type *gradients_local;
  vector_type *values_local;
  NeuralNetworkLayer *layer_local;
  vector_type *bias_gradients;
  
  local_29 = 0;
  local_28 = gradients;
  gradients_local = values;
  values_local = (vector_type *)layer;
  layer_local = (NeuralNetworkLayer *)__return_storage_ptr__;
  sVar3 = NeuralNetworkLayer::outputCount(layer);
  local_30 = 0.0;
  std::allocator<float>::allocator(&local_31);
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,sVar3,&local_30,&local_31);
  std::allocator<float>::~allocator(&local_31);
  for (local_50 = 0; sVar3 = NeuralNetworkLayer::outputCount((NeuralNetworkLayer *)values_local),
      local_50 < sVar3; local_50 = local_50 + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](local_28,local_50);
    fVar1 = *pvVar4;
    p_Var2 = &values_local->super__Vector_base<float,_std::allocator<float>_>;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](gradients_local,local_50);
    fVar6 = ActivationFunction::operator[]
                      ((ActivationFunction *)
                       &(p_Var2->_M_impl).super__Vector_impl_data._M_end_of_storage,*pvVar4);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,local_50)
    ;
    *pvVar5 = fVar1 * fVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

static vector_type biasGradientFromValues(const NeuralNetworkLayer& layer,
        const vector_type& values, const vector_type& gradients)
    {
        vector_type bias_gradients(layer.outputCount(), 0.0f);

        for (std::size_t i = 0; i < layer.outputCount(); ++i)
            bias_gradients[i] = gradients[i] * layer.m_activationFunction[values[i]];

        return bias_gradients;
    }